

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void benchmark::internal::ParseCommandLineFlags(int *argc,char **argv)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long in_RSI;
  int *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  const_iterator __end2;
  const_iterator __begin2;
  double *in_stack_00000018;
  char *in_stack_00000020;
  char *in_stack_00000028;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *__range2;
  int j;
  int i;
  string *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *in_stack_ffffffffffffffb0;
  bool *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *local_20;
  int local_18;
  int local_14;
  long local_10;
  int *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_14 = 1; local_14 < *local_8; local_14 = local_14 + 1) {
    bVar1 = ParseBoolFlag(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                          in_stack_ffffffffffffffb8);
    if ((((bVar1) ||
         (bVar1 = ParseStringFlag(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                                  in_stack_ffffffffffffffa8), bVar1)) ||
        ((bVar1 = ParseDoubleFlag(in_stack_00000028,in_stack_00000020,in_stack_00000018), bVar1 ||
         ((bVar1 = ParseInt32Flag(in_stack_00000028,in_stack_00000020,(int32_t *)in_stack_00000018),
          bVar1 || (bVar1 = ParseBoolFlag(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                                          in_stack_ffffffffffffffb8), bVar1)))))) ||
       ((bVar1 = ParseStringFlag(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                                 in_stack_ffffffffffffffa8), bVar1 ||
        ((((bVar1 = ParseStringFlag(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                                    in_stack_ffffffffffffffa8), bVar1 ||
           (bVar1 = ParseStringFlag(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                                    in_stack_ffffffffffffffa8), bVar1)) ||
          (bVar1 = ParseBoolFlag(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                                 in_stack_ffffffffffffffb8), bVar1)) ||
         (bVar1 = ParseInt32Flag(in_stack_00000028,in_stack_00000020,(int32_t *)in_stack_00000018),
         bVar1)))))) {
      for (local_18 = local_14; local_18 != *local_8; local_18 = local_18 + 1) {
        *(undefined8 *)(local_10 + (long)local_18 * 8) =
             *(undefined8 *)(local_10 + (long)(local_18 + 1) * 8);
      }
      *local_8 = *local_8 + -1;
      local_14 = local_14 + -1;
    }
    else {
      bVar1 = IsFlag((char *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
      if (bVar1) {
        PrintUsageAndExit();
      }
    }
  }
  local_30._M_array = (iterator)&stack0xffffffffffffffc0;
  local_30._M_len = 2;
  local_20 = &local_30;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
           ::begin(local_20);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          ::end(in_stack_ffffffffffffffb0);
  for (; pbVar2 != __lhs;
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pbVar2->_M_string_length) {
    __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pbVar2;
    bVar1 = std::operator!=(__lhs,(char *)__rhs);
    if (((bVar1) && (bVar1 = std::operator!=(__lhs,(char *)__rhs), bVar1)) &&
       (bVar1 = std::operator!=(__lhs,(char *)__rhs), bVar1)) {
      PrintUsageAndExit();
    }
  }
  return;
}

Assistant:

void ParseCommandLineFlags(int* argc, char** argv) {
  using namespace benchmark;
  for (int i = 1; i < *argc; ++i) {
    if (
        ParseBoolFlag(argv[i], "benchmark_list_tests",
                      &FLAGS_benchmark_list_tests) ||
        ParseStringFlag(argv[i], "benchmark_filter",
                        &FLAGS_benchmark_filter) ||
        ParseDoubleFlag(argv[i], "benchmark_min_time",
                        &FLAGS_benchmark_min_time) ||
        ParseInt32Flag(argv[i], "benchmark_repetitions",
                       &FLAGS_benchmark_repetitions) ||
        ParseBoolFlag(argv[i], "benchmark_report_aggregates_only",
                       &FLAGS_benchmark_report_aggregates_only) ||
        ParseStringFlag(argv[i], "benchmark_format",
                        &FLAGS_benchmark_format) ||
        ParseStringFlag(argv[i], "benchmark_out",
                        &FLAGS_benchmark_out) ||
        ParseStringFlag(argv[i], "benchmark_out_format",
                        &FLAGS_benchmark_out_format) ||
        ParseBoolFlag(argv[i], "color_print",
                       &FLAGS_color_print) ||
        ParseInt32Flag(argv[i], "v", &FLAGS_v)) {
      for (int j = i; j != *argc; ++j) argv[j] = argv[j + 1];

      --(*argc);
      --i;
    } else if (IsFlag(argv[i], "help")) {
      PrintUsageAndExit();
    }
  }
  for (auto const* flag : {&FLAGS_benchmark_format,
                           &FLAGS_benchmark_out_format})
  if (*flag != "console" && *flag != "json" && *flag != "csv") {
    PrintUsageAndExit();
  }
}